

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> experiment<lcp64_experiment>(lcp64_experiment exp)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  reference pvVar3;
  size_type sVar4;
  double dVar5;
  undefined1 auVar6 [64];
  pair<unsigned_long,_unsigned_long> pVar7;
  double deviation;
  uint64_t timespan;
  time_point t2;
  size_t j;
  time_point t1;
  size_t i;
  uint64_t prev_deviation;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  vector<unsigned_long,_std::allocator<unsigned_long>_> times;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffea8;
  lcp64_experiment *in_stack_fffffffffffffeb0;
  const_iterator in_stack_fffffffffffffeb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffec8;
  iterator in_stack_fffffffffffffed0;
  iterator in_stack_ffffffffffffff28;
  iterator in_stack_ffffffffffffff30;
  const_iterator in_stack_ffffffffffffff38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_90;
  rep local_88;
  undefined8 local_80;
  ulong local_78;
  undefined8 local_70;
  undefined8 local_58;
  ulong local_50;
  undefined8 local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  pair<unsigned_long,_unsigned_long> local_10;
  undefined1 extraout_var [56];
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1113d1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1113de);
  local_48 = 0;
  for (local_50 = 0; local_50 < 500; local_50 = local_50 + 1) {
    local_58 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_fffffffffffffea0,(value_type_conflict *)in_stack_fffffffffffffe98);
    sVar2 = lcp64_experiment::operator()(in_stack_fffffffffffffeb0);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       (in_stack_fffffffffffffea0);
    *pvVar3 = sVar2;
    local_70 = std::chrono::_V2::system_clock::now();
    for (local_78 = 0; local_78 < 1000; local_78 = local_78 + 1) {
      DoNotOptimizeAway<lcp64_experiment&>(in_stack_fffffffffffffeb0);
    }
    local_80 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              (in_stack_fffffffffffffea8,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffea0);
    local_90.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   in_stack_fffffffffffffe98);
    local_88 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffe98);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffe98);
    std::
    upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8._M_current);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffea0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffe98);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff30._M_current,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff28._M_current);
    if ((local_50 + 1 & 3) == 0) {
      in_stack_fffffffffffffec8._M_current = (unsigned_long *)&local_28;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x111606);
      in_stack_ffffffffffffff30 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffffe98);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffea0,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffed0 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
      in_stack_ffffffffffffff28 = in_stack_fffffffffffffed0;
    }
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
    if (0x32 < sVar4) {
      packed::math::arithmetic_mean<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffec0._M_current);
      dVar5 = packed::math::deviation<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffed0._M_current,
                         (double *)in_stack_fffffffffffffec8._M_current);
      if ((dVar5 < 10.0) ||
         (auVar1 = vcvtusi2sd_avx512f(ZEXT816(0x4024000000000000),local_48), dVar5 < auVar1._0_8_))
      break;
    }
    in_stack_fffffffffffffec0._M_current = (unsigned_long *)&local_28;
    packed::math::arithmetic_mean<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffec0._M_current);
    auVar6._0_8_ = packed::math::deviation<unsigned_long>
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffed0._M_current,
                              (double *)in_stack_fffffffffffffec8._M_current);
    auVar6._8_56_ = extraout_var;
    local_48 = vcvttsd2usi_avx512f(auVar6._0_16_);
  }
  this = &local_28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(this);
  pVar7 = std::make_pair<unsigned_long&,unsigned_long&>
                    ((unsigned_long *)this,(unsigned_long *)in_stack_fffffffffffffe98);
  local_10 = pVar7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pVar7.second);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pVar7.second);
  return local_10;
}

Assistant:

std::pair<size_t,size_t> experiment(experiment_type exp) {

    std::vector<uint64_t> times;
    std::vector<uint64_t> res;
    uint64_t prev_deviation = 0;

    for(size_t i = 0; i < MAX_SAMPLES; ++i) {
      res.push_back(0);

      res.back() = exp();

      using time_point = std::chrono::high_resolution_clock::time_point;
      time_point t1 = std::chrono::high_resolution_clock::now();

      for(size_t j = 0; j < MEASUREMENTS; ++j) {
	DoNotOptimizeAway(exp);
      }

      time_point t2 = std::chrono::high_resolution_clock::now();

      const uint64_t timespan = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1).count();

      times.insert(std::upper_bound(times.begin(), times.end(), timespan), timespan);

      if( (i+1) % 4 == 0) {
	times.pop_back();
	times.erase(times.begin());
      }
      if(times.size() > MIN_SAMPLES) {
	double deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
	if(deviation < MIN_DEVIATION) break;
	if(prev_deviation > deviation) break;
      }
      prev_deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
    }
    // std::cout << "len " << length << " means " << math::arithmetic_mean(times) << " dev: " << math::deviation(times, math::arithmetic_mean(times)) << "LCE " << res.back() << std::endl;
    return std::make_pair(times[0], times.back());
}